

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeIndexMoveto(BtCursor *pCur,UnpackedRecord *pIdxKey,int *pRes)

{
  u16 *puVar1;
  uchar *puVar2;
  MemPage **ppMVar3;
  ushort uVar4;
  byte bVar5;
  KeyInfo *pKVar6;
  anon_union_8_2_94730112_for_u *paVar7;
  MemPage *pMVar8;
  u8 *puVar9;
  int iVar10;
  u32 uVar11;
  byte *pbVar12;
  uchar *pBuf;
  ulong uVar13;
  u16 uVar14;
  int iVar15;
  int iVar16;
  code *xRecordCompare;
  i8 iVar17;
  i8 iVar18;
  uint uVar19;
  int iVar20;
  
  pKVar6 = pIdxKey->pKeyInfo;
  xRecordCompare = sqlite3VdbeRecordCompare;
  if (pKVar6->nAllField < 0xe) {
    paVar7 = (anon_union_8_2_94730112_for_u *)pIdxKey->aMem;
    uVar4 = *(u16 *)((long)paVar7 + 0x14);
    if (*pKVar6->aSortFlags == 0) {
      iVar17 = '\x01';
      iVar18 = -1;
    }
    else {
      if ((*pKVar6->aSortFlags & 2) != 0) goto LAB_0016f577;
      iVar17 = -1;
      iVar18 = '\x01';
    }
    pIdxKey->r1 = iVar18;
    pIdxKey->r2 = iVar17;
    if ((uVar4 & 4) == 0) {
      if (((uVar4 & 0x39) == 0) && (pKVar6->aColl[0] == (CollSeq *)0x0)) {
        pIdxKey->u = paVar7[1];
        pIdxKey->n = *(int *)(paVar7 + 2);
        xRecordCompare = vdbeRecordCompareString;
      }
    }
    else {
      pIdxKey->u = *paVar7;
      xRecordCompare = vdbeRecordCompareInt;
    }
  }
LAB_0016f577:
  pIdxKey->errCode = '\0';
  if ((pCur->eState == '\0') && (pCur->pPage->leaf != '\0')) {
    bVar5 = pCur->iPage;
    uVar13 = 0;
    if ((char)bVar5 < '\x01') {
      bVar5 = 0;
    }
    do {
      if (bVar5 == uVar13) {
        if (((pCur->pPage->nCell - 1 == (uint)pCur->ix) &&
            (iVar10 = indexCellCompare(pCur,(uint)pCur->ix,pIdxKey,xRecordCompare), iVar10 < 1)) &&
           (pIdxKey->errCode == '\0')) {
          *pRes = iVar10;
          goto LAB_0016f59f;
        }
        if ((('\0' < pCur->iPage) &&
            (iVar10 = indexCellCompare(pCur,0,pIdxKey,xRecordCompare), iVar10 < 1)) &&
           (pIdxKey->errCode == '\0')) {
          pCur->curFlags = pCur->curFlags & 0xfb;
          if (pCur->pPage->isInit == '\0') {
            iVar10 = sqlite3CorruptError(0x120c3);
            return iVar10;
          }
          goto LAB_0016f64c;
        }
        pIdxKey->errCode = '\0';
        break;
      }
      ppMVar3 = pCur->apPage + uVar13;
      puVar1 = pCur->aiIdx + uVar13;
      uVar13 = uVar13 + 1;
    } while ((*ppMVar3)->nCell <= *puVar1);
  }
  iVar10 = moveToRoot(pCur);
  if (iVar10 != 0) {
    if (iVar10 == 0x10) {
      *pRes = -1;
LAB_0016f59f:
      iVar10 = 0;
    }
    return iVar10;
  }
LAB_0016f64c:
LAB_0016f664:
  pMVar8 = pCur->pPage;
  iVar15 = pMVar8->nCell - 1;
  iVar20 = 0;
  iVar10 = iVar15;
  do {
    puVar9 = pMVar8->aDataOfst;
    iVar16 = iVar15 >> 1;
    uVar13 = (ulong)(CONCAT11(pMVar8->aCellIdx[(long)iVar15 & 0xfffffffffffffffeU],
                              pMVar8->aCellIdx[((long)iVar15 & 0xfffffffffffffffeU) + 1]) &
                    pMVar8->maskPage);
    pbVar12 = puVar9 + uVar13 + 1;
    bVar5 = puVar9[uVar13];
    uVar19 = (uint)bVar5;
    uVar14 = (u16)iVar16;
    if (pMVar8->max1bytePayload < bVar5) {
      if ((-1 < (char)*pbVar12) &&
         (uVar19 = (bVar5 & 0x7f) << 7 | (int)(char)*pbVar12, uVar19 <= pMVar8->maxLocal)) {
        pbVar12 = puVar9 + uVar13 + 2;
        goto LAB_0016f79d;
      }
      (*pMVar8->xParseCell)(pMVar8,puVar9 + (uVar13 - pMVar8->childPtrSize),&pCur->info);
      uVar13 = (pCur->info).nKey;
      uVar11 = (u32)uVar13;
      if (((int)uVar11 < 2) ||
         (pCur->pBt->nPage < (uint)((uVar13 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
        iVar10 = 0x1211a;
LAB_0016f85d:
        iVar15 = sqlite3CorruptError(iVar10);
      }
      else {
        pBuf = (uchar *)sqlite3Malloc((ulong)(uVar11 + 0x12));
        if (pBuf == (uchar *)0x0) {
          iVar15 = 7;
        }
        else {
          pCur->ix = uVar14;
          iVar15 = accessPayload(pCur,0,uVar11,pBuf,0);
          puVar2 = pBuf + (uVar11 & 0x7fffffff);
          puVar2[0] = '\0';
          puVar2[1] = '\0';
          puVar2[2] = '\0';
          puVar2[3] = '\0';
          puVar2[4] = '\0';
          puVar2[5] = '\0';
          puVar2[6] = '\0';
          puVar2[7] = '\0';
          puVar2[8] = '\0';
          puVar2[9] = '\0';
          puVar2[10] = '\0';
          puVar2[0xb] = '\0';
          puVar2[0xc] = '\0';
          puVar2[0xd] = '\0';
          puVar2[0xe] = '\0';
          puVar2[0xf] = '\0';
          (pBuf + (ulong)(uVar11 & 0x7fffffff) + 0x10)[0] = '\0';
          (pBuf + (ulong)(uVar11 & 0x7fffffff) + 0x10)[1] = '\0';
          pCur->curFlags = pCur->curFlags & 0xfb;
          if (iVar15 == 0) {
            iVar15 = sqlite3VdbeRecordCompare(uVar11,pBuf,pIdxKey);
            sqlite3_free(pBuf);
            goto LAB_0016f7a5;
          }
          sqlite3_free(pBuf);
        }
      }
      goto LAB_0016f891;
    }
LAB_0016f79d:
    iVar15 = (*xRecordCompare)(uVar19,pbVar12,pIdxKey);
LAB_0016f7a5:
    if (iVar15 < 0) {
      iVar20 = iVar16 + 1;
    }
    else {
      if (iVar15 == 0) {
        *pRes = 0;
        pCur->ix = uVar14;
        if (pIdxKey->errCode != '\0') {
          iVar10 = 0x1213a;
          goto LAB_0016f85d;
        }
        goto LAB_0016f88f;
      }
      iVar10 = iVar16 + -1;
    }
    if (iVar10 < iVar20) break;
    iVar15 = iVar20 + iVar10;
  } while( true );
  if (pMVar8->leaf != '\0') {
    pCur->ix = uVar14;
    *pRes = iVar15;
LAB_0016f88f:
    iVar15 = 0;
    goto LAB_0016f891;
  }
  if (iVar20 < (int)(uint)pMVar8->nCell) {
    uVar13 = (ulong)(CONCAT11(pMVar8->aCellIdx[(long)iVar20 * 2],
                              pMVar8->aCellIdx[(long)iVar20 * 2 + 1]) & pMVar8->maskPage);
  }
  else {
    uVar13 = (ulong)pMVar8->hdrOffset + 8;
  }
  uVar11 = sqlite3Get4byte(pMVar8->aData + uVar13);
  pCur->ix = (u16)iVar20;
  iVar15 = moveToChild(pCur,uVar11);
  if (iVar15 != 0) {
LAB_0016f891:
    (pCur->info).nSize = 0;
    return iVar15;
  }
  goto LAB_0016f664;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIndexMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo!=0 );

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
  pIdxKey->errCode = 0;
  assert( pIdxKey->default_rc==1
       || pIdxKey->default_rc==0
       || pIdxKey->default_rc==-1
  );


  /* Check to see if we can skip a lot of work.  Two cases:
  **
  **    (1) If the cursor is already pointing to the very last cell
  **        in the table and the pIdxKey search key is greater than or
  **        equal to that last cell, then no movement is required.
  **
  **    (2) If the cursor is on the last page of the table and the first
  **        cell on that last page is less than or equal to the pIdxKey
  **        search key, then we can start the search on the current page
  **        without needing to go back to root.
  */
  if( pCur->eState==CURSOR_VALID
   && pCur->pPage->leaf
   && cursorOnLastPage(pCur)
  ){
    int c;
    if( pCur->ix==pCur->pPage->nCell-1
     && (c = indexCellCompare(pCur, pCur->ix, pIdxKey, xRecordCompare))<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      *pRes = c;
      return SQLITE_OK;  /* Cursor already pointing at the correct spot */
    }
    if( pCur->iPage>0
     && indexCellCompare(pCur, 0, pIdxKey, xRecordCompare)<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      pCur->curFlags &= ~BTCF_ValidOvfl;
      if( !pCur->pPage->isInit ){
        return SQLITE_CORRUPT_BKPT;
      }
      goto bypass_moveto_root;  /* Start search on the current page */
    }
    pIdxKey->errCode = SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }

bypass_moveto_root:
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->curIntKey==0 );
  assert( pIdxKey!=0 );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==0 );
    lwr = 0;
    upr = pPage->nCell-1;
    idx = upr>>1; /* idx = (lwr+upr)/2; */
    for(;;){
      int nCell;  /* Size of the pCell cell in bytes */
      pCell = findCellPastPtr(pPage, idx);

      /* The maximum supported page-size is 65536 bytes. This means that
      ** the maximum number of record bytes stored on an index B-Tree
      ** page is less than 16384 bytes and may be stored as a 2-byte
      ** varint. This information is used to attempt to avoid parsing
      ** the entire cell by checking for the cases where the record is
      ** stored entirely within the b-tree page by inspecting the first
      ** 2 bytes of the cell.
      */
      nCell = pCell[0];
      if( nCell<=pPage->max1bytePayload ){
        /* This branch runs if the record-size field of the cell is a
        ** single byte varint and the record fits entirely on the main
        ** b-tree page.  */
        testcase( pCell+nCell+1==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
      }else if( !(pCell[1] & 0x80)
        && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
      ){
        /* The record-size field is a 2 byte varint and the record
        ** fits entirely on the main b-tree page.  */
        testcase( pCell+nCell+2==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
      }else{
        /* The record flows over onto one or more overflow pages. In
        ** this case the whole cell needs to be parsed, a buffer allocated
        ** and accessPayload() used to retrieve the record into the
        ** buffer before VdbeRecordCompare() can be called.
        **
        ** If the record is corrupt, the xRecordCompare routine may read
        ** up to two varints past the end of the buffer. An extra 18
        ** bytes of padding is allocated at the end of the buffer in
        ** case this happens.  */
        void *pCellKey;
        u8 * const pCellBody = pCell - pPage->childPtrSize;
        const int nOverrun = 18;  /* Size of the overrun padding */
        pPage->xParseCell(pPage, pCellBody, &pCur->info);
        nCell = (int)pCur->info.nKey;
        testcase( nCell<0 );   /* True if key size is 2^32 or more */
        testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
        testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
        testcase( nCell==2 );  /* Minimum legal index key size */
        if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
          rc = SQLITE_CORRUPT_PAGE(pPage);
          goto moveto_index_finish;
        }
        pCellKey = sqlite3Malloc( nCell+nOverrun );
        if( pCellKey==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto moveto_index_finish;
        }
        pCur->ix = (u16)idx;
        rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
        memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
        pCur->curFlags &= ~BTCF_ValidOvfl;
        if( rc ){
          sqlite3_free(pCellKey);
          goto moveto_index_finish;
        }
        c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
        sqlite3_free(pCellKey);
      }
      assert(
          (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
       && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
      );
      if( c<0 ){
        lwr = idx+1;
      }else if( c>0 ){
        upr = idx-1;
      }else{
        assert( c==0 );
        *pRes = 0;
        rc = SQLITE_OK;
        pCur->ix = (u16)idx;
        if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
        goto moveto_index_finish;
      }
      if( lwr>upr ) break;
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell || CORRUPT_DB );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_index_finish;
    }
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }
    pCur->ix = (u16)lwr;
    rc = moveToChild(pCur, chldPg);
    if( rc ) break;
  }
moveto_index_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}